

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::LegacyDataSPKM::AddCryptedKeyInner
          (LegacyDataSPKM *this,CPubKey *vchPubKey,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchCryptedSecret)

{
  bool bVar1;
  FillableSigningProvider *in_RDX;
  CPubKey *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock23;
  pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffff18;
  type in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff38;
  uchar *__k;
  char *in_stack_ffffffffffffff48;
  CPubKey *in_stack_ffffffffffffff50;
  pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_68;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff18);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_RDX,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48,(char *)in_RDI,
             (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff38 >> 0x18,0));
  bVar1 = std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
          ::empty((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                   *)in_stack_ffffffffffffff18);
  if (!bVar1) {
    __assert_fail("mapKeys.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x35e,
                  "bool wallet::LegacyDataSPKM::AddCryptedKeyInner(const CPubKey &, const std::vector<unsigned char> &)"
                 );
  }
  std::make_pair<CPubKey_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
            (&in_stack_ffffffffffffff20->first,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff18);
  __k = in_RDI[3].vch + 0x25;
  CPubKey::GetID(in_RDI);
  std::
  map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  ::operator[]((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                *)in_RDI,(key_type *)__k);
  std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator=
            (&local_68,in_stack_ffffffffffffff20);
  std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~pair
            (in_stack_ffffffffffffff18);
  FillableSigningProvider::ImplicitlyLearnRelatedKeyScripts(in_RDX,in_stack_ffffffffffffff50);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyDataSPKM::AddCryptedKeyInner(const CPubKey &vchPubKey, const std::vector<unsigned char> &vchCryptedSecret)
{
    LOCK(cs_KeyStore);
    assert(mapKeys.empty());

    mapCryptedKeys[vchPubKey.GetID()] = make_pair(vchPubKey, vchCryptedSecret);
    ImplicitlyLearnRelatedKeyScripts(vchPubKey);
    return true;
}